

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall sznet::net::TcpServer::start(TcpServer *this)

{
  EventLoop *this_00;
  bool bVar1;
  element_type *this_01;
  pointer this_02;
  Acceptor *local_78;
  code *local_70;
  undefined8 local_68;
  type local_60;
  Functor local_48;
  TcpServer *local_28;
  TcpServer *this_local;
  undefined4 local_18;
  undefined4 local_14;
  atomic<int> *local_10;
  
  local_10 = &this->m_started;
  local_14 = 1;
  local_18 = 5;
  this_local._4_4_ = 1;
  LOCK();
  this_local._0_4_ = (local_10->super___atomic_base<int>)._M_i;
  (local_10->super___atomic_base<int>)._M_i = 1;
  UNLOCK();
  if ((int)this_local == 0) {
    local_28 = this;
    this_01 = std::
              __shared_ptr_access<sznet::net::EventLoopThreadPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<sznet::net::EventLoopThreadPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_threadPool);
    EventLoopThreadPool::start(this_01,&this->m_threadInitCallback);
    this_02 = std::unique_ptr<sznet::net::Acceptor,_std::default_delete<sznet::net::Acceptor>_>::
              operator->(&this->m_acceptor);
    bVar1 = Acceptor::listenning(this_02);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!m_acceptor->listenning()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpServer.cpp"
                    ,0x37,"void sznet::net::TcpServer::start()");
    }
    this_00 = this->m_loop;
    local_70 = Acceptor::listen;
    local_68 = 0;
    local_78 = get_pointer<sznet::net::Acceptor>(&this->m_acceptor);
    std::bind<void(sznet::net::Acceptor::*)(),sznet::net::Acceptor*>
              (&local_60,(offset_in_Acceptor_to_subr *)&local_70,&local_78);
    std::function<void()>::
    function<std::_Bind<void(sznet::net::Acceptor::*(sznet::net::Acceptor*))()>,void>
              ((function<void()> *)&local_48,&local_60);
    EventLoop::runInLoop(this_00,&local_48);
    std::function<void_()>::~function(&local_48);
  }
  return;
}

Assistant:

void TcpServer::start()
{
	if (m_started.exchange(1) == 0)
	{
		m_threadPool->start(m_threadInitCallback);
		assert(!m_acceptor->listenning());
		// listen��������ȷ����m_loop�����߳���ִ��
		m_loop->runInLoop(std::bind(&Acceptor::listen, get_pointer(m_acceptor)));
	}
}